

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall
osqp::anon_unknown_6::UpdateUpperTriangularObjectiveMatrix
          (anon_unknown_6 *this,SparseMatrix<double,_0,_long_long> *objective_matrix_upper_triangle,
          OSQPWorkspaceHelper *workspace)

{
  bool bVar1;
  OSQPWorkspace *work;
  OSQPWorkspace *pOVar2;
  size_t sVar3;
  c_int cVar4;
  string_view message;
  string_view message_00;
  c_int in_stack_ffffffffffffff30;
  string *__return_storage_ptr__;
  anon_unknown_6 *Px_new;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  int local_9c;
  Index IStack_98;
  int return_code;
  c_int nnzP;
  byte local_85;
  Index local_78;
  Index local_70;
  FormatSpecTemplate<(absl::FormatConversionCharSet)655355,_(absl::FormatConversionCharSet)655355,_(absl::FormatConversionCharSet)655355>
  local_68;
  string local_58;
  undefined1 local_38 [16];
  size_t local_28;
  c_int num_variables;
  OSQPWorkspaceHelper *workspace_local;
  SparseMatrix<double,_0,_long_long> *objective_matrix_upper_triangle_local;
  Status *result;
  
  local_28 = ((workspace->super_OSQPWorkspace).data)->n;
  Px_new = this;
  num_variables = (c_int)workspace;
  workspace_local = (OSQPWorkspaceHelper *)objective_matrix_upper_triangle;
  objective_matrix_upper_triangle_local = (SparseMatrix<double,_0,_long_long> *)this;
  work = (OSQPWorkspace *)
         Eigen::SparseMatrix<double,_0,_long_long>::rows(objective_matrix_upper_triangle);
  pOVar2 = (OSQPWorkspace *)
           Eigen::SparseMatrix<double,_0,_long_long>::cols
                     ((SparseMatrix<double,_0,_long_long> *)workspace_local);
  if ((work == pOVar2) &&
     (sVar3 = Eigen::SparseMatrix<double,_0,_long_long>::rows
                        ((SparseMatrix<double,_0,_long_long> *)workspace_local), sVar3 == local_28))
  {
    local_85 = 0;
    VerifySameSparsity(this,(SparseMatrix<double,_0,_long_long> *)workspace_local,
                       *(csc **)(*(long *)num_variables + 0x10),local_28);
    bVar1 = absl::Status::ok((Status *)this);
    if (!bVar1) {
      local_85 = 1;
    }
    nnzP._4_4_ = (uint)!bVar1;
    if ((local_85 & 1) == 0) {
      absl::Status::~Status((Status *)this);
    }
    if (nnzP._4_4_ == 0) {
      IStack_98 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_>::nonZeros
                            ((SparseCompressedBase<Eigen::SparseMatrix<double,_0,_long_long>_> *)
                             workspace_local);
      Eigen::SparseMatrix<double,_0,_long_long>::valuePtr
                ((SparseMatrix<double,_0,_long_long> *)workspace_local);
      cVar4 = osqp_update_P(work,(c_float *)Px_new,(c_int *)this,in_stack_ffffffffffffff30);
      local_9c = (int)cVar4;
      if (local_9c == 0) {
        absl::OkStatus();
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_b0,"Unable to update OSQP P matrix: unrecognized error code.");
        message_00._M_str = (char *)local_b0._M_len;
        message_00._M_len = (size_t)this;
        absl::UnknownError(message_00);
      }
    }
  }
  else {
    absl::str_format_internal::
    FormatSpecTemplate<(absl::FormatConversionCharSet)655355,_(absl::FormatConversionCharSet)655355,_(absl::FormatConversionCharSet)655355>
    ::FormatSpecTemplate
              (&local_68,
               "The new objective matrix should be square with dimension equal to the number of variables. Matrix dimensions: %d x %d, num_variables=%d"
              );
    local_70 = Eigen::SparseMatrix<double,_0,_long_long>::rows
                         ((SparseMatrix<double,_0,_long_long> *)workspace_local);
    local_78 = Eigen::SparseMatrix<double,_0,_long_long>::cols
                         ((SparseMatrix<double,_0,_long_long> *)workspace_local);
    __return_storage_ptr__ = &local_58;
    absl::StrFormat<long,_long,_long_long>
              (__return_storage_ptr__,&local_68,&local_70,&local_78,(longlong *)&local_28);
    local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)__return_storage_ptr__);
    message._M_str = local_38._0_8_;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (Status)(uintptr_t)Px_new;
}

Assistant:

absl::Status UpdateUpperTriangularObjectiveMatrix(
    const Eigen::SparseMatrix<double, Eigen::ColMajor, c_int>&
        objective_matrix_upper_triangle,
    OSQPWorkspaceHelper* workspace) {
  const c_int num_variables = workspace->data->n;

  if (objective_matrix_upper_triangle.rows() !=
          objective_matrix_upper_triangle.cols() ||
      objective_matrix_upper_triangle.rows() != num_variables) {
    return absl::InvalidArgumentError(absl::StrFormat(
        "The new objective matrix should be square with dimension equal to the "
        "number of variables. Matrix dimensions: %d x %d, num_variables=%d",
        objective_matrix_upper_triangle.rows(),
        objective_matrix_upper_triangle.cols(), num_variables));
  }

  OSQP_RETURN_IF_ERROR(VerifySameSparsity(objective_matrix_upper_triangle,
                                          workspace->data->P, num_variables));

  c_int nnzP = objective_matrix_upper_triangle.nonZeros();

  const int return_code = osqp_update_P(
      workspace, objective_matrix_upper_triangle.valuePtr(), OSQP_NULL, nnzP);
  if (return_code == 0) {
    return absl::OkStatus();
  }
  return absl::UnknownError(
      "Unable to update OSQP P matrix: unrecognized error code.");
}